

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriHelper.cpp
# Opt level: O1

bool Js::UriHelper::DecodeByteFromHex(char16 digit1,char16 digit2,uchar *value)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined8 in_RAX;
  undefined4 *puVar4;
  undefined8 uStack_28;
  int x;
  
  uStack_28 = in_RAX;
  BVar3 = NumberUtilities::FHexDigit(digit1,(int *)((long)&uStack_28 + 4));
  if (BVar3 != 0) {
    if (0xf < uStack_28._4_4_) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/UriHelper.cpp"
                                  ,0x240,"(static_cast<unsigned int>(x) <= 0xfU)",
                                  "static_cast<unsigned int>(x) <= 0xfU");
      if (!bVar2) goto LAB_00d96c7f;
      *puVar4 = 0;
    }
    *value = uStack_28._4_1_ << 4;
    BVar3 = NumberUtilities::FHexDigit(digit2,(int *)((long)&uStack_28 + 4));
    if (BVar3 != 0) {
      if (0xf < uStack_28._4_4_) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/UriHelper.cpp"
                                    ,0x247,"(static_cast<unsigned int>(x) <= 0xfU)",
                                    "static_cast<unsigned int>(x) <= 0xfU");
        if (!bVar2) {
LAB_00d96c7f:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      *value = *value + uStack_28._4_1_;
      return true;
    }
  }
  return false;
}

Assistant:

bool UriHelper::DecodeByteFromHex(const char16 digit1, const char16 digit2, unsigned char &value)
    {
        int x;
        if(!Js::NumberUtilities::FHexDigit(digit1, &x))
        {
            return false;
        }
        Assert(static_cast<unsigned int>(x) <= 0xfU);
        value = static_cast<unsigned char>(x) << 4;

        if(!Js::NumberUtilities::FHexDigit(digit2, &x))
        {
            return false;
        }
        Assert(static_cast<unsigned int>(x) <= 0xfU);
        value += static_cast<unsigned char>(x);

        return true;
    }